

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall protozero::MessageFilter::SetUnrecoverableErrorState(MessageFilter *this)

{
  reference pvVar1;
  pointer puVar2;
  value_type *state;
  MessageFilter *this_local;
  
  this->error_ = true;
  perfetto::std::
  vector<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
  ::clear(&this->stack_);
  perfetto::std::
  vector<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
  ::resize(&this->stack_,1);
  pvVar1 = perfetto::std::
           vector<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
           ::operator[](&this->stack_,0);
  pvVar1->eat_next_bytes = 0xffffffff;
  pvVar1->in_bytes_limit = 0xffffffff;
  pvVar1->passthrough_eaten_bytes = false;
  puVar2 = perfetto::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&this->out_buf_);
  this->out_ = puVar2;
  return;
}

Assistant:

void MessageFilter::SetUnrecoverableErrorState() {
  error_ = true;
  stack_.clear();
  stack_.resize(1);
  auto& state = stack_[0];
  state.eat_next_bytes = UINT32_MAX;
  state.in_bytes_limit = UINT32_MAX;
  state.passthrough_eaten_bytes = false;
  out_ = out_buf_.get();  // Reset the write pointer.
}